

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  Fad<double> *pFVar6;
  ulong uVar7;
  ulong uVar8;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar9;
  
  pFVar9 = (fadexpr->fadexpr_).right_;
  pFVar6 = (pFVar9->fadexpr_).right_;
  uVar2 = (pFVar6->dx_).num_elts;
  uVar8 = (ulong)uVar2;
  uVar3 = (this->dx_).num_elts;
  if (uVar2 == uVar3) {
    if (uVar2 == 0) goto LAB_00dc09b6;
    pdVar5 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar2 == 0) {
      if (uVar3 != 0) {
        pdVar5 = (this->dx_).ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
          pFVar9 = (fadexpr->fadexpr_).right_;
          pFVar6 = (pFVar9->fadexpr_).right_;
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00dc09b6;
    }
    if (uVar3 != 0) {
      pdVar5 = (this->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
        pFVar9 = (fadexpr->fadexpr_).right_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar2) {
      uVar7 = uVar8 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar7);
    (this->dx_).ptr_to_data = pdVar5;
    pFVar6 = (pFVar9->fadexpr_).right_;
    if ((pFVar6->dx_).num_elts == 0) {
      if (0 < (int)uVar2) {
        dVar1 = (fadexpr->fadexpr_).left_.constant_;
        uVar7 = 0;
        do {
          pdVar5[uVar7] = pFVar6->defaultVal * dVar1;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      goto LAB_00dc09b6;
    }
  }
  if (0 < (int)uVar2) {
    pdVar4 = (pFVar6->dx_).ptr_to_data;
    uVar7 = 0;
    do {
      pdVar5[uVar7] = pdVar4[uVar7] * (fadexpr->fadexpr_).left_.constant_;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
LAB_00dc09b6:
  this->val_ = ((pFVar9->fadexpr_).left_.constant_ + pFVar6->val_) *
               (fadexpr->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}